

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

IRIns * aa_findcnew(jit_State *J,IRIns *ir)

{
  IRIns *pIVar1;
  IRIns *local_30;
  IRIns *ir1;
  IRIns *ir_local;
  jit_State *J_local;
  
  ir1 = ir;
  while( true ) {
    if ((ir1->field_1).o != ')') {
      if ((ir1->field_1).o == 'S') {
        local_30 = ir1;
      }
      else {
        local_30 = (IRIns *)0x0;
      }
      return local_30;
    }
    if ((0x7fff < (ir1->field_0).op1) &&
       (pIVar1 = aa_findcnew(J,(J->cur).ir + (ir1->field_0).op1), pIVar1 != (IRIns *)0x0)) break;
    if ((ir1->field_0).op2 < 0x8000) {
      return (IRIns *)0x0;
    }
    ir1 = (J->cur).ir + (ir1->field_0).op2;
  }
  return pIVar1;
}

Assistant:

static IRIns *aa_findcnew(jit_State *J, IRIns *ir)
{
  while (ir->o == IR_ADD) {
    if (!irref_isk(ir->op1)) {
      IRIns *ir1 = aa_findcnew(J, IR(ir->op1));  /* Left-recursion. */
      if (ir1) return ir1;
    }
    if (irref_isk(ir->op2)) return NULL;
    ir = IR(ir->op2);  /* Flatten right-recursion. */
  }
  return ir->o == IR_CNEW ? ir : NULL;
}